

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O0

vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> * __thiscall
cfd::core::DescriptorScriptReference::GenerateAddresses
          (vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> *__return_storage_ptr__,
          DescriptorScriptReference *this,NetType net_type)

{
  bool bVar1;
  Address local_1e0;
  Pubkey local_58;
  reference local_40;
  DescriptorKeyReference *key;
  const_iterator __end3;
  const_iterator __begin3;
  vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
  *__range3;
  DescriptorScriptReference *pDStack_18;
  NetType net_type_local;
  DescriptorScriptReference *this_local;
  vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> *result;
  
  __range3._3_1_ = 0;
  __range3._4_4_ = net_type;
  pDStack_18 = this;
  this_local = (DescriptorScriptReference *)__return_storage_ptr__;
  ::std::vector<cfd::core::Address,_std::allocator<cfd::core::Address>_>::vector
            (__return_storage_ptr__);
  if ((this->script_type_ == kDescriptorScriptMulti) ||
     (this->script_type_ == kDescriptorScriptSortedMulti)) {
    __end3 = ::std::
             vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
             ::begin(&this->keys_);
    key = (DescriptorKeyReference *)
          ::std::
          vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
          ::end(&this->keys_);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<const_cfd::core::DescriptorKeyReference_*,_std::vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>_>
                                       *)&key), bVar1) {
      local_40 = __gnu_cxx::
                 __normal_iterator<const_cfd::core::DescriptorKeyReference_*,_std::vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>_>
                 ::operator*(&__end3);
      DescriptorKeyReference::GetPubkey(&local_58,local_40);
      ::std::vector<cfd::core::Address,std::allocator<cfd::core::Address>>::
      emplace_back<cfd::core::NetType&,cfd::core::Pubkey,std::vector<cfd::core::AddressFormatData,std::allocator<cfd::core::AddressFormatData>>const&>
                ((vector<cfd::core::Address,std::allocator<cfd::core::Address>> *)
                 __return_storage_ptr__,(NetType *)((long)&__range3 + 4),&local_58,
                 &this->addr_prefixes_);
      Pubkey::~Pubkey(&local_58);
      __gnu_cxx::
      __normal_iterator<const_cfd::core::DescriptorKeyReference_*,_std::vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>_>
      ::operator++(&__end3);
    }
  }
  else {
    GenerateAddress(&local_1e0,this,__range3._4_4_);
    ::std::vector<cfd::core::Address,_std::allocator<cfd::core::Address>_>::push_back
              (__return_storage_ptr__,&local_1e0);
    core::Address::~Address(&local_1e0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Address> DescriptorScriptReference::GenerateAddresses(
    NetType net_type) const {
  std::vector<Address> result;
  if ((script_type_ == DescriptorScriptType::kDescriptorScriptMulti) ||
      (script_type_ == DescriptorScriptType::kDescriptorScriptSortedMulti)) {
    for (const auto& key : keys_) {
      result.emplace_back(net_type, key.GetPubkey(), addr_prefixes_);
    }
  } else {
    result.push_back(GenerateAddress(net_type));
  }
  return result;
}